

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot_stmt.cpp
# Opt level: O2

unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> __thiscall
duckdb::Transformer::CreatePivotStatement
          (Transformer *this,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement)

{
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var1;
  pointer pCVar2;
  pointer pMVar3;
  ParserException *this_00;
  pointer pPVar4;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *in_RDX;
  Transformer *entry;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> this_01;
  allocator local_91;
  _Tuple_impl<0UL,_duckdb::MultiStatement_*,_std::default_delete<duckdb::MultiStatement>_> local_90;
  __uniq_ptr_impl<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
  local_88;
  __uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_> local_80;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *local_78;
  undefined1 local_70 [64];
  
  entry = (Transformer *)statement;
  local_80._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl =
       (tuple<duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>)
       (tuple<duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>)this;
  local_78 = in_RDX;
  make_uniq<duckdb::MultiStatement>();
  this_01._M_head_impl =
       statement[0x12].
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  _Var1._M_head_impl =
       statement[0x13].
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  while( true ) {
    if (this_01._M_head_impl == _Var1._M_head_impl) {
      pMVar3 = unique_ptr<duckdb::MultiStatement,_std::default_delete<duckdb::MultiStatement>,_true>
               ::operator->((unique_ptr<duckdb::MultiStatement,_std::default_delete<duckdb::MultiStatement>,_true>
                             *)&local_90);
      ::std::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>
                ((vector<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>>
                  *)&pMVar3->statements,local_78);
      *(_Head_base<0UL,_duckdb::MultiStatement_*,_false> *)
       local_80._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl =
           local_90.super__Head_base<0UL,_duckdb::MultiStatement_*,_false>._M_head_impl;
      return (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
             (_Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>)
             local_80._M_t.
             super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
             .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
    }
    pCVar2 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
             ::operator->((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                           *)this_01._M_head_impl);
    if (pCVar2->has_parameters == true) break;
    pMVar3 = unique_ptr<duckdb::MultiStatement,_std::default_delete<duckdb::MultiStatement>,_true>::
             operator->((unique_ptr<duckdb::MultiStatement,_std::default_delete<duckdb::MultiStatement>,_true>
                         *)&local_90);
    local_88._M_t.
    super__Tuple_impl<0UL,_duckdb::Transformer::CreatePivotEntry_*,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
    .super__Head_base<0UL,_duckdb::Transformer::CreatePivotEntry_*,_false>._M_head_impl =
         (tuple<duckdb::Transformer::CreatePivotEntry_*,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
          )(this_01._M_head_impl)->_vptr_SQLStatement;
    (this_01._M_head_impl)->_vptr_SQLStatement = (_func_int **)0x0;
    GenerateCreateEnumStmt
              ((Transformer *)local_70,
               (unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                *)entry);
    entry = (Transformer *)local_70;
    ::std::
    vector<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>
              ((vector<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>>
                *)&pMVar3->statements,
               (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
               local_70);
    if ((Transformer *)local_70._0_8_ != (Transformer *)0x0) {
      (**(code **)(*(long *)local_70._0_8_ + 8))();
    }
    local_70._0_8_ = (Transformer *)0x0;
    ::std::
    unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
    ::~unique_ptr((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                   *)&local_88);
    this_01._M_head_impl = (SQLStatement *)&(this_01._M_head_impl)->type;
  }
  this_00 = (ParserException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)local_70,
             "PIVOT statements with pivot elements extracted from the data cannot have parameters in their source.\nIn order to use parameters the PIVOT values must be manually specified, e.g.:\nPIVOT ... ON %s IN (val1, val2, ...)"
             ,&local_91);
  pCVar2 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
           ::operator->((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                         *)this_01._M_head_impl);
  pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&pCVar2->column);
  (*(pPVar4->super_BaseExpression)._vptr_BaseExpression[8])(local_70 + 0x20,pPVar4);
  ParserException::ParserException<std::__cxx11::string>
            (this_00,(string *)local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_70 + 0x20))
  ;
  __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<SQLStatement> Transformer::CreatePivotStatement(unique_ptr<SQLStatement> statement) {
	auto result = make_uniq<MultiStatement>();
	for (auto &pivot : pivot_entries) {
		if (pivot->has_parameters) {
			throw ParserException(
			    "PIVOT statements with pivot elements extracted from the data cannot have parameters in their source.\n"
			    "In order to use parameters the PIVOT values must be manually specified, e.g.:\n"
			    "PIVOT ... ON %s IN (val1, val2, ...)",
			    pivot->column->ToString());
		}
		result->statements.push_back(GenerateCreateEnumStmt(std::move(pivot)));
	}
	result->statements.push_back(std::move(statement));
	// FIXME: drop the types again!?
	//	for(auto &pivot : pivot_entries) {
	//		result->statements.push_back(GenerateDropEnumStmt(std::move(pivot->enum_name)));
	//	}
	return std::move(result);
}